

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O0

SectionHdrWrapper * __thiscall PEFile::extendLastSection(PEFile *this,bufsize_t addedSize)

{
  bool bVar1;
  int iVar2;
  SectionHdrWrapper *this_00;
  undefined4 extraout_var;
  offset_t oVar3;
  ulong val;
  bufsize_t bVar4;
  bufsize_t newVSize;
  bufsize_t secVSize;
  offset_t secVOffset;
  bufsize_t secNewRSize;
  offset_t secROffset;
  bufsize_t fullSize;
  SectionHdrWrapper *secHdr;
  WatchedLocker lock;
  bufsize_t newSize;
  bufsize_t addedSize_local;
  PEFile *this_local;
  
  lock.showLock = false;
  lock._49_7_ = 0;
  WatchedLocker::WatchedLocker((WatchedLocker *)&secHdr,&this->m_peMutex,false,"extendLastSection");
  this_00 = _getLastSection(this);
  if (this_00 == (SectionHdrWrapper *)0x0) {
    this_local = (PEFile *)0x0;
    bVar1 = true;
  }
  else {
    iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[2])();
    lock._48_8_ = CONCAT44(extraout_var,iVar2) + addedSize;
    oVar3 = SectionHdrWrapper::getContentOffset(this_00,RAW,false);
    if (oVar3 == 0xffffffffffffffff) {
      this_local = (PEFile *)0x0;
      bVar1 = true;
    }
    else {
      val = lock._48_8_ - oVar3;
      ExeElementWrapper::setNumValue((ExeElementWrapper *)this_00,3,val);
      oVar3 = SectionHdrWrapper::getContentOffset(this_00,RVA,false);
      bVar4 = SectionHdrWrapper::getContentSize(this_00,RVA,false);
      if (bVar4 < val) {
        ExeElementWrapper::setNumValue((ExeElementWrapper *)this_00,1,val);
        setVirtualSize(this,oVar3 + val);
      }
      bVar1 = false;
    }
  }
  WatchedLocker::~WatchedLocker((WatchedLocker *)&secHdr);
  if (!bVar1) {
    (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer._vptr_AbstractByteBuffer[10]
    )(this,lock._48_8_);
    this_local = (PEFile *)getLastSection(this);
  }
  return (SectionHdrWrapper *)this_local;
}

Assistant:

SectionHdrWrapper* PEFile::extendLastSection(bufsize_t addedSize)
{
    bufsize_t newSize = 0;
    
    { //scope0
        WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
        SectionHdrWrapper* secHdr = _getLastSection();
        if (!secHdr) return nullptr;

        //TODO: check overlay...
        const bufsize_t fullSize = getContentSize();
        newSize = fullSize + addedSize;

        const offset_t secROffset = secHdr->getContentOffset(Executable::RAW, false);
        if (secROffset == INVALID_ADDR) {
            return NULL;
        }
        const bufsize_t secNewRSize = newSize - secROffset; //include overlay in section
        secHdr->setNumValue(SectionHdrWrapper::RSIZE, uint64_t(secNewRSize));
        
        const offset_t secVOffset = secHdr->getContentOffset(Executable::RVA, false);
        const bufsize_t secVSize = secHdr->getContentSize(Executable::RVA, false);

        // if the previous virtual size is smaller than the new raw size, then update it:
        if (secVSize < secNewRSize) {
            secHdr->setNumValue(SectionHdrWrapper::VSIZE, uint64_t(secNewRSize));

            // if the virtual size of section has changed,
            // update the Size of Image (saved in the header):
            bufsize_t newVSize = secVOffset + secNewRSize;
            this->setVirtualSize(newVSize);
        }

    } //!scope0
    
    //update raw size:
    this->resize(newSize);
    //finally, retrieve the resized section:
    return getLastSection();
}